

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O0

void __thiscall
ConsoleTable::ConsoleTable
          (ConsoleTable *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          headers)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  value_type_conflict local_d0;
  const_iterator local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  allocator local_9a;
  allocator local_99;
  allocator local_98;
  undefined1 local_97;
  undefined1 local_96;
  allocator local_95;
  allocator local_94;
  allocator local_93;
  undefined1 local_92;
  undefined1 local_91;
  allocator local_90;
  allocator local_8f;
  allocator local_8e;
  allocator local_8d;
  allocator local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  allocator local_85;
  allocator local_84;
  allocator local_83;
  undefined1 local_82;
  undefined1 local_81;
  allocator local_80;
  allocator local_7f;
  allocator local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  allocator local_78;
  allocator local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  allocator local_70;
  allocator local_6f;
  allocator local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  undefined1 local_68;
  undefined1 local_67;
  allocator local_66;
  allocator local_65;
  allocator local_64;
  allocator local_63;
  allocator local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  undefined1 local_58;
  undefined1 local_57;
  allocator local_56;
  allocator local_55;
  allocator local_54;
  undefined1 local_53;
  undefined1 local_52;
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d [20];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_39;
  ConsoleTable *local_38;
  iterator pbStack_30;
  ConsoleTable *local_20;
  ConsoleTable *this_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  headers_local;
  
  pbStack_30 = (iterator)headers._M_len;
  local_38 = (ConsoleTable *)headers._M_array;
  local_20 = this;
  this_local = local_38;
  headers_local._M_array = pbStack_30;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_39);
  __l._M_len = (size_type)pbStack_30;
  __l._M_array = (iterator)local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->headers,__l,&local_39);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_39);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->rows);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->widths);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->BasicStyle,"-",local_4d);
  local_61 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).vertical,"|",&local_4e);
  local_60 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).top,"+",&local_4f);
  local_53 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).top.intersect,"+",&local_50);
  local_52 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).top.right,"+",&local_51);
  local_52 = 0;
  local_53 = 0;
  local_5f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).middle,"+",&local_54);
  local_58 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).middle.intersect,"+",&local_55);
  local_57 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).middle.right,"+",&local_56);
  local_57 = 0;
  local_58 = 0;
  local_5e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).bottom,"+",&local_59);
  local_5d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).bottom.intersect,"+",&local_5a);
  local_5c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->BasicStyle).bottom.right,"+",&local_5b);
  local_5c = 0;
  local_5d = 0;
  local_5e = 0;
  local_5f = 0;
  local_60 = 0;
  local_61 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_5b);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_56);
  std::allocator<char>::~allocator((allocator<char> *)&local_55);
  std::allocator<char>::~allocator((allocator<char> *)&local_54);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e);
  std::allocator<char>::~allocator((allocator<char> *)local_4d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->LineStyle,anon_var_dwarf_7131,&local_62);
  local_76 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->LineStyle).vertical,anon_var_dwarf_7147,&local_63);
  local_75 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->LineStyle).top,anon_var_dwarf_7151,&local_64);
  local_68 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).top.intersect,anon_var_dwarf_715b,&local_65);
  local_67 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->LineStyle).top.right,anon_var_dwarf_7165,&local_66)
  ;
  local_67 = 0;
  local_68 = 0;
  local_74 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->LineStyle).middle,anon_var_dwarf_716f,&local_69);
  local_6d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).middle.intersect,anon_var_dwarf_7179,&local_6a);
  local_6c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).middle.right,anon_var_dwarf_7183,&local_6b);
  local_6c = 0;
  local_6d = 0;
  local_73 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->LineStyle).bottom,anon_var_dwarf_718d,&local_6e);
  local_72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).bottom.intersect,anon_var_dwarf_7197,&local_6f);
  local_71 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->LineStyle).bottom.right,anon_var_dwarf_71a1,&local_70);
  local_71 = 0;
  local_72 = 0;
  local_73 = 0;
  local_74 = 0;
  local_75 = 0;
  local_76 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_66);
  std::allocator<char>::~allocator((allocator<char> *)&local_65);
  std::allocator<char>::~allocator((allocator<char> *)&local_64);
  std::allocator<char>::~allocator((allocator<char> *)&local_63);
  std::allocator<char>::~allocator((allocator<char> *)&local_62);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->DoubleLineStyle,anon_var_dwarf_71ab,&local_77);
  local_8b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).vertical,anon_var_dwarf_71b5,&local_78);
  local_8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->DoubleLineStyle).top,anon_var_dwarf_71bf,&local_79)
  ;
  local_7d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).top.intersect,anon_var_dwarf_71c9,&local_7a);
  local_7c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).top.right,anon_var_dwarf_71d3,&local_7b);
  local_7c = 0;
  local_7d = 0;
  local_89 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).middle,anon_var_dwarf_71dd,&local_7e);
  local_82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).middle.intersect,anon_var_dwarf_71e7,&local_7f);
  local_81 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).middle.right,anon_var_dwarf_71f1,&local_80);
  local_81 = 0;
  local_82 = 0;
  local_88 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).bottom,anon_var_dwarf_71fb,&local_83);
  local_87 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).bottom.intersect,anon_var_dwarf_7205,&local_84);
  local_86 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&(this->DoubleLineStyle).bottom.right,anon_var_dwarf_720f,&local_85);
  local_86 = 0;
  local_87 = 0;
  local_88 = 0;
  local_89 = 0;
  local_8a = 0;
  local_8b = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_85);
  std::allocator<char>::~allocator((allocator<char> *)&local_84);
  std::allocator<char>::~allocator((allocator<char> *)&local_83);
  std::allocator<char>::~allocator((allocator<char> *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_77);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->InvisibleStyle," ",&local_8c);
  local_a0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).vertical," ",&local_8d);
  local_9f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).top," ",&local_8e);
  local_92 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).top.intersect," ",&local_8f);
  local_91 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).top.right," ",&local_90);
  local_91 = 0;
  local_92 = 0;
  local_9e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).middle," ",&local_93);
  local_97 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).middle.intersect," ",&local_94);
  local_96 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).middle.right," ",&local_95);
  local_96 = 0;
  local_97 = 0;
  local_9d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).bottom," ",&local_98);
  local_9c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).bottom.intersect," ",&local_99);
  local_9b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&(this->InvisibleStyle).bottom.right," ",&local_9a);
  local_9b = 0;
  local_9c = 0;
  local_9d = 0;
  local_9e = 0;
  local_9f = 0;
  local_a0 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_9a);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_95);
  std::allocator<char>::~allocator((allocator<char> *)&local_94);
  std::allocator<char>::~allocator((allocator<char> *)&local_93);
  std::allocator<char>::~allocator((allocator<char> *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c);
  TableStyle::TableStyle(&this->style,&this->BasicStyle);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->SPACE_CHARACTER," ",(allocator *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this->padding = 1;
  __begin1 = (const_iterator)&this_local;
  __end1 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__begin1);
  column = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)__begin1);
  for (; __end1 != column; __end1 = __end1 + 0x20) {
    local_c8 = __end1;
    local_d0 = std::__cxx11::string::length();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->widths,&local_d0);
  }
  return;
}

Assistant:

ConsoleTable::ConsoleTable(std::initializer_list<std::string> headers) : headers{headers} {
    for (const auto &column : headers) {
        widths.push_back(column.length());
    }
}